

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::EncodeString
          (string *__return_storage_ptr__,NumericCharacterEntity *this,string *s)

{
  ulong uVar1;
  key_type_conflict *pkVar2;
  mapped_type *pmVar3;
  ulong start;
  char c;
  string encoded;
  key_type_conflict local_71;
  string local_70;
  string local_50;
  
  uVar1 = s->_M_string_length;
  if (uVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_70);
  }
  else {
    for (start = 0; start < uVar1; start = start + 1) {
      pkVar2 = (key_type_conflict *)std::__cxx11::string::at((ulong)s);
      local_71 = *pkVar2;
      pmVar3 = std::
               map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->encodings_table_,&local_71);
      std::__cxx11::string::string((string *)&local_70,(string *)pmVar3);
      if (local_70._M_string_length != 0) {
        std::__cxx11::string::string((string *)&local_50,(string *)s);
        EncodeRemaining(__return_storage_ptr__,this,&local_50,start,&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::~string((string *)&local_70);
      uVar1 = s->_M_string_length;
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SubjectFormatter::NumericCharacterEntity::EncodeString(std::string s)
{
    if (s.empty())
    {
        return "";
    }

    for (size_t i = 0; i < s.length(); i++)
    {
        char c = s.at(i);
        std::string encoded = c < 255 ? encodings_table_[c] : CharacterEntity(c);
        if (!encoded.empty())
        {
            return EncodeRemaining(s, i, encoded);
        }
    }

    return s;
}